

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O3

void __thiscall
SkylineBinPack::AddSkylineLevel(SkylineBinPack *this,int skylineNodeIndex,Rect *rect)

{
  uint uVar1;
  SkylineNode *__dest;
  SkylineNode *pSVar2;
  uint uVar3;
  int in_ECX;
  int iVar4;
  int iVar5;
  SkylineNode newNode;
  SkylineNode local_3c;
  
  if (this->useWasteMap == true) {
    AddWasteMapArea(this,skylineNodeIndex,rect->width,in_ECX,rect->y);
  }
  local_3c.x = rect->x;
  local_3c.y = rect->height + rect->y;
  local_3c.width = rect->width;
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Insert
            (&this->skyLine,skylineNodeIndex,&local_3c);
  if (this->binWidth < local_3c.width + local_3c.x) {
    __assert_fail("newNode.x + newNode.width <= binWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0xe1,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
  }
  if (this->binHeight < local_3c.y) {
    __assert_fail("newNode.y <= binHeight",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0xe2,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
  }
  uVar1 = skylineNodeIndex + 1;
  uVar3 = (this->skyLine).Count;
  if (uVar1 < uVar3) {
    do {
      pSVar2 = (this->skyLine).Array;
      iVar4 = pSVar2[uVar1].x;
      if (iVar4 < pSVar2[(uint)skylineNodeIndex].x) {
        __assert_fail("skyLine[i-1].x <= skyLine[i].x",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0xe6,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
      }
      iVar5 = pSVar2[(uint)skylineNodeIndex].x + pSVar2[(uint)skylineNodeIndex].width;
      if (iVar5 <= iVar4) break;
      __dest = pSVar2 + uVar1;
      __dest->x = iVar5;
      iVar4 = (iVar4 - iVar5) + __dest->width;
      __dest->width = iVar4;
      if (0 < iVar4) break;
      uVar3 = uVar3 - 1;
      (this->skyLine).Count = uVar3;
      if (uVar1 <= uVar3 && uVar3 - uVar1 != 0) {
        memmove(__dest,pSVar2 + (skylineNodeIndex + 2),(ulong)(uVar3 - uVar1) * 0xc);
        uVar3 = (this->skyLine).Count;
      }
    } while (uVar1 < uVar3);
  }
  MergeSkylines(this);
  return;
}

Assistant:

void SkylineBinPack::AddSkylineLevel(int skylineNodeIndex, const Rect &rect)
{
	// First track all wasted areas and mark them into the waste map if we're using one.
	if (useWasteMap)
		AddWasteMapArea(skylineNodeIndex, rect.width, rect.height, rect.y);

	SkylineNode newNode;
	newNode.x = rect.x;
	newNode.y = rect.y + rect.height;
	newNode.width = rect.width;
	skyLine.Insert(skylineNodeIndex, newNode);

	assert(newNode.x + newNode.width <= binWidth);
	assert(newNode.y <= binHeight);

	for(unsigned i = skylineNodeIndex+1; i < skyLine.Size(); ++i)
	{
		assert(skyLine[i-1].x <= skyLine[i].x);

		if (skyLine[i].x < skyLine[i-1].x + skyLine[i-1].width)
		{
			int shrink = skyLine[i-1].x + skyLine[i-1].width - skyLine[i].x;

			skyLine[i].x += shrink;
			skyLine[i].width -= shrink;

			if (skyLine[i].width <= 0)
			{
				skyLine.Delete(i);
				--i;
			}
			else
				break;
		}
		else
			break;
	}
	MergeSkylines();
}